

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fImplementationLimitTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::CompressedTextureFormatsQueryCase::iterate
          (CompressedTextureFormatsQueryCase *this)

{
  glGetIntegervFunc p_Var1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  GLenum err;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  size_type __n;
  reference pvVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  reference piVar9;
  char *description;
  Enum<int,_2UL> EVar10;
  Enum<int,_2UL> local_588;
  MessageBuilder local_578;
  _Self local_3f8;
  int local_3ec;
  _Self local_3e8;
  undefined1 local_3d9;
  int local_3d8;
  int iStack_3d4;
  bool found;
  deUint32 fmt_1;
  int ndx;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_3c8;
  undefined1 local_3c0 [8];
  set<int,_std::less<int>,_std::allocator<int>_> formatSet;
  Enum<int,_2UL> local_378;
  MessageBuilder local_368;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1e8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1e0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1d8;
  const_iterator fmt;
  bool allFormatsOk;
  allocator<int> local_39;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> formats;
  GLint numFormats;
  Functions *gl;
  CompressedTextureFormatsQueryCase *this_local;
  Functions *gl_00;
  
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar4);
  formats.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = LimitQuery::query<int>(gl_00,0x86a2);
  __n = (size_type)
        formats.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_;
  std::allocator<int>::allocator(&local_39);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,__n,&local_39);
  std::allocator<int>::~allocator(&local_39);
  bVar2 = 1;
  if (0 < formats.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_) {
    p_Var1 = gl_00->getIntegerv;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,0);
    (*p_Var1)(0x86a3,pvVar6);
  }
  err = (*gl_00->getError)();
  glu::checkError(err,"Query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fImplementationLimitTests.cpp"
                  ,0x128);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&fmt,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)&fmt,(char (*) [10])"Reported:");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&fmt);
  local_1e0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_38);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_1d8,
             &local_1e0);
  while( true ) {
    local_1e8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_38);
    bVar3 = __gnu_cxx::operator!=(&local_1d8,&local_1e8);
    if (!bVar3) break;
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_368,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    piVar9 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_1d8);
    EVar10 = glu::getCompressedTextureFormatStr(*piVar9);
    local_378.m_getName = EVar10.m_getName;
    local_378.m_value = EVar10.m_value;
    pMVar8 = tcu::MessageBuilder::operator<<(&local_368,&local_378);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_368);
    formatSet._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator++(&local_1d8,0);
  }
  local_3c8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_38);
  _fmt_1 = std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)local_38);
  std::set<int,std::less<int>,std::allocator<int>>::
  set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((set<int,std::less<int>,std::allocator<int>> *)local_3c0,local_3c8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_fmt_1);
  for (iStack_3d4 = 0; iStack_3d4 < 10; iStack_3d4 = iStack_3d4 + 1) {
    local_3ec = *(int *)(s_requiredCompressedTexFormats + (long)iStack_3d4 * 4);
    local_3d8 = local_3ec;
    local_3e8._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)local_3c0,&local_3ec);
    local_3f8._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)local_3c0);
    local_3d9 = std::operator!=(&local_3e8,&local_3f8);
    if (!(bool)local_3d9) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_578,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<(&local_578,(char (*) [8])0x2b7b4e9);
      EVar10 = glu::getCompressedTextureFormatStr(local_3d8);
      local_588.m_getName = EVar10.m_getName;
      local_588.m_value = EVar10.m_value;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_588);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [13])" is missing!");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_578);
      bVar2 = 0;
    }
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_3c0);
  description = "Requirement not satisfied";
  if (bVar2 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar2,
             description);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
		const GLint				numFormats		= query<GLint>(gl, GL_NUM_COMPRESSED_TEXTURE_FORMATS);
		vector<GLint>			formats			(numFormats);
		bool					allFormatsOk	= true;

		if (numFormats > 0)
			gl.getIntegerv(GL_COMPRESSED_TEXTURE_FORMATS, &formats[0]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

		// Log formats.
		m_testCtx.getLog() << TestLog::Message << "Reported:" << TestLog::EndMessage;
		for (vector<GLint>::const_iterator fmt = formats.begin(); fmt != formats.end(); fmt++)
			m_testCtx.getLog() << TestLog::Message << glu::getCompressedTextureFormatStr(*fmt) << TestLog::EndMessage;

		// Check that all required formats are in list.
		{
			set<GLint> formatSet(formats.begin(), formats.end());

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_requiredCompressedTexFormats); ndx++)
			{
				const deUint32	fmt		= s_requiredCompressedTexFormats[ndx];
				const bool		found	= formatSet.find(fmt) != formatSet.end();

				if (!found)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: " << glu::getCompressedTextureFormatStr(fmt) << " is missing!" << TestLog::EndMessage;
					allFormatsOk = false;
				}
			}
		}

		m_testCtx.setTestResult(allFormatsOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								allFormatsOk ? "Pass"				: "Requirement not satisfied");
		return STOP;
	}